

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DefUseManager::AnalyzeInstDefUse(DefUseManager *this,Instruction *inst)

{
  pointer pIVar1;
  Instruction *l_inst;
  pointer inst_00;
  
  AnalyzeInstDef(this,inst);
  AnalyzeInstUse(this,inst);
  pIVar1 = (inst->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (inst_00 = (inst->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start; inst_00 != pIVar1; inst_00 = inst_00 + 1
      ) {
    AnalyzeInstDefUse(this,inst_00);
  }
  return;
}

Assistant:

void DefUseManager::AnalyzeInstDefUse(Instruction* inst) {
  AnalyzeInstDef(inst);
  AnalyzeInstUse(inst);
  // Analyze lines last otherwise they will be cleared when inst is
  // cleared by preceding two calls
  for (auto& l_inst : inst->dbg_line_insts()) AnalyzeInstDefUse(&l_inst);
}